

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_helper.c
# Opt level: O0

char * nghttp2_http2_strerror(uint32_t error_code)

{
  char *pcStack_10;
  uint32_t error_code_local;
  
  switch(error_code) {
  case 0:
    pcStack_10 = "NO_ERROR";
    break;
  case 1:
    pcStack_10 = "PROTOCOL_ERROR";
    break;
  case 2:
    pcStack_10 = "INTERNAL_ERROR";
    break;
  case 3:
    pcStack_10 = "FLOW_CONTROL_ERROR";
    break;
  case 4:
    pcStack_10 = "SETTINGS_TIMEOUT";
    break;
  case 5:
    pcStack_10 = "STREAM_CLOSED";
    break;
  case 6:
    pcStack_10 = "FRAME_SIZE_ERROR";
    break;
  case 7:
    pcStack_10 = "REFUSED_STREAM";
    break;
  case 8:
    pcStack_10 = "CANCEL";
    break;
  case 9:
    pcStack_10 = "COMPRESSION_ERROR";
    break;
  case 10:
    pcStack_10 = "CONNECT_ERROR";
    break;
  case 0xb:
    pcStack_10 = "ENHANCE_YOUR_CALM";
    break;
  case 0xc:
    pcStack_10 = "INADEQUATE_SECURITY";
    break;
  case 0xd:
    pcStack_10 = "HTTP_1_1_REQUIRED";
    break;
  default:
    pcStack_10 = "unknown";
  }
  return pcStack_10;
}

Assistant:

const char *nghttp2_http2_strerror(uint32_t error_code) {
  switch (error_code) {
  case NGHTTP2_NO_ERROR:
    return "NO_ERROR";
  case NGHTTP2_PROTOCOL_ERROR:
    return "PROTOCOL_ERROR";
  case NGHTTP2_INTERNAL_ERROR:
    return "INTERNAL_ERROR";
  case NGHTTP2_FLOW_CONTROL_ERROR:
    return "FLOW_CONTROL_ERROR";
  case NGHTTP2_SETTINGS_TIMEOUT:
    return "SETTINGS_TIMEOUT";
  case NGHTTP2_STREAM_CLOSED:
    return "STREAM_CLOSED";
  case NGHTTP2_FRAME_SIZE_ERROR:
    return "FRAME_SIZE_ERROR";
  case NGHTTP2_REFUSED_STREAM:
    return "REFUSED_STREAM";
  case NGHTTP2_CANCEL:
    return "CANCEL";
  case NGHTTP2_COMPRESSION_ERROR:
    return "COMPRESSION_ERROR";
  case NGHTTP2_CONNECT_ERROR:
    return "CONNECT_ERROR";
  case NGHTTP2_ENHANCE_YOUR_CALM:
    return "ENHANCE_YOUR_CALM";
  case NGHTTP2_INADEQUATE_SECURITY:
    return "INADEQUATE_SECURITY";
  case NGHTTP2_HTTP_1_1_REQUIRED:
    return "HTTP_1_1_REQUIRED";
  default:
    return "unknown";
  }
}